

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v9::detail::format_uint<4u,char,unsigned__int128>
          (detail *this,char *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  byte in_R8B;
  char *local_60;
  uint digit;
  char *digits;
  char *end;
  bool upper_local;
  int num_digits_local;
  unsigned___int128 value_local;
  char *buffer_local;
  
  value_local._8_8_ = CONCAT44(in_register_00000014,num_digits);
  value_local._0_8_ = buffer;
  buffer_local = (char *)(this + (int)CONCAT71(in_register_00000009,upper));
  do {
    if ((in_R8B & 1) == 0) {
      local_60 = "0123456789abcdef";
    }
    else {
      local_60 = "0123456789ABCDEF";
    }
    buffer_local[-1] = local_60[(uint)value_local & 0xf];
    value_local._0_8_ = (char *)(value_local._8_8_ << 0x3c | (ulong)(char *)value_local >> 4);
    value_local._8_8_ = value_local._8_8_ >> 4;
    buffer_local = buffer_local + -1;
  } while ((char *)value_local != (char *)0x0 || value_local._8_8_ != 0);
  return (char *)(this + (int)CONCAT71(in_register_00000009,upper));
}

Assistant:

FMT_CONSTEXPR auto format_uint(Char* buffer, UInt value, int num_digits,
                               bool upper = false) -> Char* {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = static_cast<unsigned>(value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}